

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O1

void UTF_fgets_test2(char *fname)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  bool bVar7;
  char buf [128];
  undefined8 uStack_b0;
  char local_a8;
  undefined7 uStack_a7;
  short local_a0;
  
  uStack_b0 = 0x102dd3;
  __stream = fopen(fname,"rb");
  if (__stream == (FILE *)0x0) {
    UTF_test(0x7f,false);
    return;
  }
  uStack_b0 = 0x102dea;
  iVar1 = feof(__stream);
  if (iVar1 == 0) {
    sVar4 = 1;
    uStack_b0 = 0x102faf;
    sVar3 = fread(&local_a8,1,10,__stream);
    if (sVar3 == 0) goto LAB_00102df2;
    do {
      if (*(char *)((long)&uStack_b0 + sVar4 + 7) == '\n') {
        if ((sVar4 == 1) || (*(char *)((long)&uStack_b0 + sVar4 + 6) != '\r')) {
          if (sVar4 == 10) {
            sVar4 = sVar4 - 1;
          }
          (&local_a8)[sVar4] = '\0';
          sVar5 = sVar4;
        }
        else {
          *(undefined2 *)((long)&uStack_b0 + sVar4 + 6) = 10;
          sVar5 = sVar4;
        }
        break;
      }
      bVar7 = sVar4 != sVar3;
      sVar5 = sVar3;
      sVar4 = sVar4 + 1;
    } while (bVar7);
    if (sVar5 == 10) {
      sVar5 = 9;
LAB_00103207:
      (&local_a8)[sVar5] = '\0';
    }
    else if (sVar5 == sVar3) goto LAB_00103207;
    if (sVar5 - sVar3 != 0) {
      uStack_b0 = 0x103221;
      iVar1 = fseek(__stream,sVar5 - sVar3,1);
      if (iVar1 != 0) goto LAB_00102df2;
    }
    pcVar2 = (undefined1 *)0x0;
    if (local_a8 != '\0') {
      pcVar2 = &local_a8;
    }
  }
  else {
LAB_00102df2:
    pcVar2 = (undefined1 *)0x0;
  }
  uStack_b0 = 0x102e07;
  UTF_test(0x83,pcVar2 == &local_a8);
  uStack_b0 = 0x102e31;
  UTF_test(0x84,local_a0 == 0x38 && CONCAT71(uStack_a7,local_a8) == 0x3736353433323130);
  uStack_b0 = 0x102e39;
  iVar1 = feof(__stream);
  if (iVar1 == 0) {
    sVar4 = 1;
    uStack_b0 = 0x102ffd;
    sVar3 = fread(&local_a8,1,10,__stream);
    if (sVar3 == 0) goto LAB_00102e41;
    do {
      if (*(char *)((long)&uStack_b0 + sVar4 + 7) == '\n') {
        if ((sVar4 == 1) || (*(char *)((long)&uStack_b0 + sVar4 + 6) != '\r')) {
          if (sVar4 == 10) {
            sVar4 = sVar4 - 1;
          }
          (&local_a8)[sVar4] = '\0';
          sVar5 = sVar4;
        }
        else {
          *(undefined2 *)((long)&uStack_b0 + sVar4 + 6) = 10;
          sVar5 = sVar4;
        }
        break;
      }
      bVar7 = sVar4 != sVar3;
      sVar5 = sVar3;
      sVar4 = sVar4 + 1;
    } while (bVar7);
    if (sVar5 == 10) {
      sVar5 = 9;
LAB_00103259:
      (&local_a8)[sVar5] = '\0';
    }
    else if (sVar5 == sVar3) goto LAB_00103259;
    if (sVar5 - sVar3 != 0) {
      uStack_b0 = 0x103273;
      iVar1 = fseek(__stream,sVar5 - sVar3,1);
      if (iVar1 != 0) goto LAB_00102e41;
    }
    pcVar2 = (undefined1 *)0x0;
    if (local_a8 != '\0') {
      pcVar2 = &local_a8;
    }
  }
  else {
LAB_00102e41:
    pcVar2 = (undefined1 *)0x0;
  }
  uStack_b0 = 0x102e56;
  UTF_test(0x85,pcVar2 == &local_a8);
  uStack_b0 = 0x102e80;
  UTF_test(0x86,local_a0 == 0x37 && CONCAT71(uStack_a7,local_a8) == 0x3635343332313039);
  uStack_b0 = 0x102e88;
  iVar1 = feof(__stream);
  if (iVar1 == 0) {
    sVar4 = 1;
    uStack_b0 = 0x10304b;
    sVar3 = fread(&local_a8,1,10,__stream);
    if (sVar3 == 0) goto LAB_00102e90;
    do {
      if (*(char *)((long)&uStack_b0 + sVar4 + 7) == '\n') {
        if ((sVar4 == 1) || (*(char *)((long)&uStack_b0 + sVar4 + 6) != '\r')) {
          if (sVar4 == 10) {
            sVar4 = sVar4 - 1;
          }
          (&local_a8)[sVar4] = '\0';
          sVar5 = sVar4;
        }
        else {
          *(undefined2 *)((long)&uStack_b0 + sVar4 + 6) = 10;
          sVar5 = sVar4;
        }
        break;
      }
      bVar7 = sVar4 != sVar3;
      sVar5 = sVar3;
      sVar4 = sVar4 + 1;
    } while (bVar7);
    if (sVar5 == 10) {
      sVar5 = 9;
LAB_001032ab:
      (&local_a8)[sVar5] = '\0';
    }
    else if (sVar5 == sVar3) goto LAB_001032ab;
    if (sVar5 - sVar3 != 0) {
      uStack_b0 = 0x1032c5;
      iVar1 = fseek(__stream,sVar5 - sVar3,1);
      if (iVar1 != 0) goto LAB_00102e90;
    }
    pcVar2 = (undefined1 *)0x0;
    if (local_a8 != '\0') {
      pcVar2 = &local_a8;
    }
  }
  else {
LAB_00102e90:
    pcVar2 = (undefined1 *)0x0;
  }
  uStack_b0 = 0x102ea5;
  UTF_test(0x87,pcVar2 == &local_a8);
  uStack_b0 = 0x102ecf;
  UTF_test(0x88,local_a0 == 0x36 && CONCAT71(uStack_a7,local_a8) == 0x3534333231303938);
  uStack_b0 = 0x102ed7;
  iVar1 = feof(__stream);
  if (iVar1 == 0) {
    sVar4 = 1;
    uStack_b0 = 0x103099;
    sVar3 = fread(&local_a8,1,10,__stream);
    if (sVar3 == 0) goto LAB_00102edf;
    do {
      if (*(char *)((long)&uStack_b0 + sVar4 + 7) == '\n') {
        if ((sVar4 == 1) || (*(char *)((long)&uStack_b0 + sVar4 + 6) != '\r')) {
          if (sVar4 == 10) {
            sVar4 = sVar4 - 1;
          }
          (&local_a8)[sVar4] = '\0';
          sVar5 = sVar4;
        }
        else {
          *(undefined2 *)((long)&uStack_b0 + sVar4 + 6) = 10;
          sVar5 = sVar4;
        }
        break;
      }
      bVar7 = sVar4 != sVar3;
      sVar5 = sVar3;
      sVar4 = sVar4 + 1;
    } while (bVar7);
    if (sVar5 == 10) {
      sVar5 = 9;
LAB_001032fd:
      (&local_a8)[sVar5] = '\0';
    }
    else if (sVar5 == sVar3) goto LAB_001032fd;
    if (sVar5 - sVar3 != 0) {
      uStack_b0 = 0x103317;
      iVar1 = fseek(__stream,sVar5 - sVar3,1);
      if (iVar1 != 0) goto LAB_00102edf;
    }
    pcVar2 = (undefined1 *)0x0;
    if (local_a8 != '\0') {
      pcVar2 = &local_a8;
    }
  }
  else {
LAB_00102edf:
    pcVar2 = (undefined1 *)0x0;
  }
  uStack_b0 = 0x102ef4;
  UTF_test(0x89,pcVar2 == &local_a8);
  uStack_b0 = 0x102f1a;
  UTF_test(0x8a,(char)local_a0 == '\0' && CONCAT71(uStack_a7,local_a8) == 0x3433323130393837);
  uStack_b0 = 0x102f22;
  iVar1 = feof(__stream);
  bVar7 = true;
  if (iVar1 != 0) goto LAB_001031c2;
  sVar4 = 1;
  uStack_b0 = 0x102f48;
  sVar3 = fread(&local_a8,1,10,__stream);
  if (sVar3 == 0) goto LAB_001031c2;
  do {
    if (*(char *)((long)&uStack_b0 + sVar4 + 7) == '\n') {
      if ((sVar4 == 1) || (*(char *)((long)&uStack_b0 + sVar4 + 6) != '\r')) {
        if (sVar4 == 10) {
          sVar4 = sVar4 - 1;
        }
        (&local_a8)[sVar4] = '\0';
        sVar5 = sVar4;
      }
      else {
        *(undefined2 *)((long)&uStack_b0 + sVar4 + 6) = 10;
        sVar5 = sVar4;
      }
      break;
    }
    bVar6 = sVar4 != sVar3;
    sVar5 = sVar3;
    sVar4 = sVar4 + 1;
  } while (bVar6);
  if (sVar5 == 10) {
    sVar5 = 9;
LAB_0010319c:
    (&local_a8)[sVar5] = '\0';
  }
  else if (sVar5 == sVar3) goto LAB_0010319c;
  if (sVar5 - sVar3 != 0) {
    uStack_b0 = 0x1031b6;
    iVar1 = fseek(__stream,sVar5 - sVar3,1);
    if (iVar1 != 0) goto LAB_001031c2;
  }
  bVar7 = local_a8 == '\0';
LAB_001031c2:
  uStack_b0 = 0x1031d0;
  UTF_test(0x8b,bVar7);
  uStack_b0 = 0x1031d8;
  fclose(__stream);
  return;
}

Assistant:

void UTF_fgets_test2(const char *fname)
{
    FILE *fp;
    char buf[128];

    fp = fopen(fname, "rb");
    if (!fp)
    {
        UTF_test(__LINE__, fp != NULL);
        return;
    }

    UTF_test(__LINE__, UTF_fgets(buf, 10, fp) == buf);
    UTF_test(__LINE__, strcmp(buf, "012345678") == 0);
    UTF_test(__LINE__, UTF_fgets(buf, 10, fp) == buf);
    UTF_test(__LINE__, strcmp(buf, "901234567") == 0);
    UTF_test(__LINE__, UTF_fgets(buf, 10, fp) == buf);
    UTF_test(__LINE__, strcmp(buf, "890123456") == 0);
    UTF_test(__LINE__, UTF_fgets(buf, 10, fp) == buf);
    UTF_test(__LINE__, strcmp(buf, "78901234") == 0);
    UTF_test(__LINE__, UTF_fgets(buf, 10, fp) == NULL);

    fclose(fp);
}